

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_35::InMemoryDirectory::EntryImpl::set
          (EntryImpl *this,Own<const_kj::Directory> *value)

{
  Own<const_kj::Directory> *other;
  Own<const_kj::Directory> local_28;
  Own<const_kj::Directory> *local_18;
  Own<const_kj::Directory> *value_local;
  EntryImpl *this_local;
  
  local_18 = value;
  value_local = (Own<const_kj::Directory> *)this;
  other = mv<kj::Own<kj::Directory_const>>(value);
  Own<const_kj::Directory>::Own(&local_28,other);
  OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
  ::
  init<kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode>
            ((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
              *)&this->node,(DirectoryNode *)&local_28);
  DirectoryNode::~DirectoryNode((DirectoryNode *)&local_28);
  return;
}

Assistant:

void set(Own<const Directory>&& value) {
      node.init<DirectoryNode>(DirectoryNode { kj::mv(value) });
    }